

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::testLimitsJsonCodec(void)

{
  ValidSchema schema;
  char *s;
  char *in_stack_00000188;
  DecoderPtr *in_stack_00000318;
  EncoderPtr *in_stack_00000320;
  ValidSchema local_48 [2];
  ValidSchema local_28 [2];
  char *local_8;
  
  local_8 = 
  "{ \"type\": \"record\", \"name\": \"r\", \"fields\": [{ \"name\": \"d1\", \"type\": \"double\" },{ \"name\": \"d2\", \"type\": \"double\" },{ \"name\": \"d3\", \"type\": \"double\" },{ \"name\": \"f1\", \"type\": \"float\" },{ \"name\": \"f2\", \"type\": \"float\" },{ \"name\": \"f3\", \"type\": \"float\" }]}"
  ;
  parsing::makeValidSchema(in_stack_00000188);
  avro::jsonEncoder(local_28);
  avro::jsonDecoder(local_48);
  testLimits(in_stack_00000320,in_stack_00000318);
  boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x225db1);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x225dbb);
  ValidSchema::~ValidSchema((ValidSchema *)0x225dc5);
  return;
}

Assistant:

static void testLimitsJsonCodec()
{
    const char* s = "{ \"type\": \"record\", \"name\": \"r\", \"fields\": ["
        "{ \"name\": \"d1\", \"type\": \"double\" },"
        "{ \"name\": \"d2\", \"type\": \"double\" },"
        "{ \"name\": \"d3\", \"type\": \"double\" },"
        "{ \"name\": \"f1\", \"type\": \"float\" },"
        "{ \"name\": \"f2\", \"type\": \"float\" },"
        "{ \"name\": \"f3\", \"type\": \"float\" }"
    "]}";
    ValidSchema schema = parsing::makeValidSchema(s);
    testLimits(jsonEncoder(schema), jsonDecoder(schema));
}